

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>::insert
          (array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
           *this,CString *item,range r)

{
  CString *pCVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int new_len;
  
  if (r.begin < r.end) {
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/tl/range.h"
                   ,0x96,1,"empty");
    iVar4 = (int)((long)r.begin - (long)this->list >> 3) * -0x55555555;
    incsize(this);
    iVar3 = this->num_elements;
    lVar5 = (long)iVar3;
    new_len = iVar3 + 1;
    if (this->list_size <= iVar3) {
      alloc(this,new_len);
    }
    this->num_elements = new_len;
    if (iVar4 < iVar3) {
      lVar6 = lVar5 * 0x18 + 8;
      do {
        pCVar1 = this->list;
        *(undefined8 *)((long)pCVar1 + lVar6 + -8) = *(undefined8 *)(pCVar1 + (long)new_len + -2);
        string_base<allocator_default<char>_>::operator=
                  ((string_base<allocator_default<char>_> *)((long)&pCVar1->m_Hash + lVar6),
                   &pCVar1[(long)new_len + -2].m_Replacement);
        lVar5 = lVar5 + -1;
        new_len = new_len + -1;
        lVar6 = lVar6 + -0x18;
      } while (iVar4 < lVar5);
    }
    uVar2 = item->m_ContextHash;
    pCVar1 = this->list + iVar4;
    pCVar1->m_Hash = item->m_Hash;
    pCVar1->m_ContextHash = uVar2;
    string_base<allocator_default<char>_>::operator=(&pCVar1->m_Replacement,&item->m_Replacement);
    return this->num_elements + -1;
  }
  iVar3 = add(this,item);
  return iVar3;
}

Assistant:

int insert(const T& item, range r)
	{
		if(r.empty())
			return add(item);

		int index = (int)(&r.front()-list);
		incsize();
		set_size(size()+1);

		for(int i = num_elements-1; i > index; i--)
			list[i] = list[i-1];

		list[index] = item;

		return num_elements-1;
	}